

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::processRoot
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  TABLE *pTVar2;
  TAG *pTVar3;
  ostream *poVar4;
  Session *pSVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  ostream *stream;
  string href;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  HR hr;
  EM em;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  CAPTION caption;
  TABLE table;
  
  stream = (ostream *)(b + 0x10);
  HTML::TABLE::TABLE(&table,stream);
  pTVar2 = HTML::TABLE::border(&table,1);
  pTVar2 = HTML::TABLE::cellspacing(pTVar2,2);
  pTVar3 = &HTML::TABLE::width(pTVar2,100)->super_TAG;
  HTML::TAG::text(pTVar3);
  HTML::CAPTION::CAPTION(&caption,stream);
  HTML::TAG::text(&caption.super_TAG);
  HTML::EM::EM(&em,stream);
  HTML::TAG::text(&em.super_TAG);
  Session::numSessions();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::operator<<(poVar4," Sessions managed by QuickFIX");
  HTML::HR::HR(&hr,stream);
  HTML::TAG::text(&hr.super_TAG);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/resetSessions",&href);
  pTVar3 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  HTML::TAG::text<char[6]>(pTVar3,(char (*) [6])"RESET");
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/refreshSessions",&href);
  pTVar3 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])"REFRESH");
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/enableSessions",&href);
  pTVar3 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  HTML::TAG::text<char[7]>(pTVar3,(char (*) [7])"ENABLE");
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/disableSessions",&href);
  pTVar3 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])"DISABLE");
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TAG::~TAG(&caption.super_TAG);
  HTML::TR::TR((TR *)&caption,stream);
  HTML::TAG::text(&caption.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])0x1c94b9);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[15]>(pTVar3,(char (*) [15])0x1cf8ef);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])"Enabled");
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[13]>(pTVar3,(char (*) [13])"Session Time");
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[10]>(pTVar3,(char (*) [10])"Logged On");
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[14]>(pTVar3,(char (*) [14])"Next Incoming");
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&sessions);
  pTVar3 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  HTML::TAG::text<char[14]>(pTVar3,(char (*) [14])"Next Outgoing");
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TAG::~TAG(&caption.super_TAG);
  Session::getSessions();
  for (p_Var7 = sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &sessions._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    pSVar5 = Session::lookupSession((SessionID *)(p_Var7 + 1));
    if (pSVar5 != (Session *)0x0) {
      HTML::TR::TR((TR *)&caption.super_TAG,stream);
      HTML::TAG::text(&caption.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      HTML::TAG::text(&em.super_TAG);
      std::operator+(&local_3e0,"/session?BeginString=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var7[1]._M_left);
      std::operator+(&local_3c0,&local_3e0,"&SenderCompID=");
      std::operator+(&local_770,&local_3c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var7[4]._M_parent);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hr.super_TAG,&local_770,"&TargetCompID=");
      std::operator+(&href,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &hr.super_TAG,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 7));
      std::__cxx11::string::~string((string *)&hr.super_TAG);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      if (p_Var7[9]._M_left != (_Base_ptr)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &hr.super_TAG,"&SessionQualifier=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var7[9]._M_parent);
        std::__cxx11::string::append((string *)&href);
        std::__cxx11::string::~string((string *)&hr.super_TAG);
      }
      HTML::A::A((A *)&hr.super_TAG,stream);
      pTVar3 = &HTML::A::href((A *)&hr.super_TAG,&href)->super_TAG;
      std::__cxx11::string::string((string *)&local_770,(string *)&p_Var7[10]._M_left);
      HTML::TAG::text<std::__cxx11::string>(pTVar3,&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      HTML::TAG::~TAG(&hr.super_TAG);
      std::__cxx11::string::~string((string *)&href);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      pcVar6 = "No sessions defined for acceptor";
      if ((pSVar5->m_state).m_initiate != false) {
        pcVar6 = "No sessions defined for initiator";
      }
      hr.super_TAG._vptr_TAG = (_func_int **)(pcVar6 + 0x18);
      HTML::TAG::text<char_const*>(&em.super_TAG,(char **)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      pcVar6 = "no";
      if ((pSVar5->m_state).m_enabled != false) {
        pcVar6 = "yes";
      }
      hr.super_TAG._vptr_TAG = (_func_int **)pcVar6;
      HTML::TAG::text<char_const*>(&em.super_TAG,(char **)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      UtcTimeStamp::now();
      bVar1 = TimeRange::isInRange(&pSVar5->m_sessionTime,(UtcTimeStamp *)&hr.super_TAG);
      pcVar6 = "no";
      if (bVar1) {
        pcVar6 = "yes";
      }
      href._M_dataplus._M_p = pcVar6;
      HTML::TAG::text<char_const*>(&em.super_TAG,(char **)&href);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      pcVar6 = "no";
      if (((pSVar5->m_state).m_receivedLogon & (pSVar5->m_state).m_sentLogon) != 0) {
        pcVar6 = "yes";
      }
      hr.super_TAG._vptr_TAG = (_func_int **)pcVar6;
      HTML::TAG::text<char_const*>(&em.super_TAG,(char **)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      hr.super_TAG._vptr_TAG = (_func_int **)SessionState::getNextTargetMsgSeqNum(&pSVar5->m_state);
      HTML::TAG::text<unsigned_long>(&em.super_TAG,(unsigned_long *)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      hr.super_TAG._vptr_TAG = (_func_int **)SessionState::getNextSenderMsgSeqNum(&pSVar5->m_state);
      HTML::TAG::text<unsigned_long>(&em.super_TAG,(unsigned_long *)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TAG::~TAG(&caption.super_TAG);
    }
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&sessions._M_t);
  HTML::TAG::~TAG(&table.super_TAG);
  return;
}

Assistant:

void HttpConnection::processRoot(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  TABLE table(b);
  table.border(1).cellspacing(2).width(100).text();

  {
    CAPTION caption(b);
    caption.text();
    EM em(b);
    em.text();
    b << Session::numSessions() << " Sessions managed by QuickFIX";
    {
      HR hr(b);
      hr.text();
    }
    {
      b << NBSP;
      A a(b);
      a.href("/resetSessions" + request.getParameterString()).text("RESET");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/refreshSessions" + request.getParameterString()).text("REFRESH");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/enableSessions" + request.getParameterString()).text("ENABLE");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/disableSessions" + request.getParameterString()).text("DISABLE");
    }
  }

  {
    TR tr(b);
    tr.text();
    {
      TD td(b);
      td.align("center").text("Session");
    }
    {
      TD td(b);
      td.align("center").text("ConnectionType");
    }
    {
      TD td(b);
      td.align("center").text("Enabled");
    }
    {
      TD td(b);
      td.align("center").text("Session Time");
    }
    {
      TD td(b);
      td.align("center").text("Logged On");
    }
    {
      TD td(b);
      td.align("center").text("Next Incoming");
    }
    {
      TD td(b);
      td.align("center").text("Next Outgoing");
    }
  }

  std::set<SessionID> sessions = Session::getSessions();
  for (const SessionID &sessionID : sessions) {
    Session *pSession = Session::lookupSession(sessionID);
    if (!pSession) {
      continue;
    }

    {
      TR tr(b);
      tr.text();
      {
        TD td(b);
        td.text();
        std::string href = "/session?BeginString=" + sessionID.getBeginString().getValue()
                           + "&SenderCompID=" + sessionID.getSenderCompID().getValue()
                           + "&TargetCompID=" + sessionID.getTargetCompID().getValue();
        if (sessionID.getSessionQualifier().size()) {
          href += "&SessionQualifier=" + sessionID.getSessionQualifier();
        }

        A a(b);
        a.href(href).text(sessionID.toString());
      }
      {
        TD td(b);
        td.text(pSession->isInitiator() ? "initiator" : "acceptor");
      }
      {
        TD td(b);
        td.text(pSession->isEnabled() ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->isSessionTime(UtcTimeStamp::now()) ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->isLoggedOn() ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->getExpectedTargetNum());
      }
      {
        TD td(b);
        td.text(pSession->getExpectedSenderNum());
      }
    }
  }
}